

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tenor_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::TenorTest_test_valid_near_far_tenor_validation_Test::TestBody
          (TenorTest_test_valid_near_far_tenor_validation_Test *this)

{
  char *in_R9;
  AssertHelper local_50;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  string local_40;
  AssertionResult gtest_ar_;
  
  gtest_ar_.success_ =
       (bool)bidfx_public_api::Tenor::IsValidNearFarTenor
                       ((Tenor *)&Tenor::TODAY,(Tenor *)&Tenor::TOMORROW);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,(internal *)&gtest_ar_,
               (AssertionResult *)"Tenor::IsValidNearFarTenor(Tenor::TODAY, Tenor::TOMORROW)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/tenor_test.cpp"
               ,0x18,local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    std::__cxx11::string::~string((string *)&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ =
       (bool)bidfx_public_api::Tenor::IsValidNearFarTenor
                       ((Tenor *)&Tenor::TODAY,(Tenor *)&Tenor::IN_1_WEEK);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,(internal *)&gtest_ar_,
               (AssertionResult *)"Tenor::IsValidNearFarTenor(Tenor::TODAY, Tenor::IN_1_WEEK)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/tenor_test.cpp"
               ,0x19,local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    std::__cxx11::string::~string((string *)&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ =
       (bool)bidfx_public_api::Tenor::IsValidNearFarTenor
                       ((Tenor *)&Tenor::SPOT,(Tenor *)&Tenor::IN_1_YEAR);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,(internal *)&gtest_ar_,
               (AssertionResult *)"Tenor::IsValidNearFarTenor(Tenor::SPOT, Tenor::IN_1_YEAR)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/tenor_test.cpp"
               ,0x1a,local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    std::__cxx11::string::~string((string *)&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ =
       (bool)bidfx_public_api::Tenor::IsValidNearFarTenor
                       ((Tenor *)&Tenor::IN_11_MONTHS,(Tenor *)&Tenor::IN_1_YEAR);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,(internal *)&gtest_ar_,
               (AssertionResult *)
               "Tenor::IsValidNearFarTenor(Tenor::IN_11_MONTHS, Tenor::IN_1_YEAR)","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/tenor_test.cpp"
               ,0x1b,local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    std::__cxx11::string::~string((string *)&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  return;
}

Assistant:

TEST(TenorTest, test_valid_near_far_tenor_validation)
{
    EXPECT_TRUE(Tenor::IsValidNearFarTenor(Tenor::TODAY, Tenor::TOMORROW));
    EXPECT_TRUE(Tenor::IsValidNearFarTenor(Tenor::TODAY, Tenor::IN_1_WEEK));
    EXPECT_TRUE(Tenor::IsValidNearFarTenor(Tenor::SPOT, Tenor::IN_1_YEAR));
    EXPECT_TRUE(Tenor::IsValidNearFarTenor(Tenor::IN_11_MONTHS, Tenor::IN_1_YEAR));
}